

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

int Abc_ManReadInteger(char *pFileName,char *pToken)

{
  Vec_Str_t *p;
  char *pcVar1;
  size_t sVar2;
  char *pStr;
  Vec_Str_t *vStr;
  int Result;
  char *pToken_local;
  char *pFileName_local;
  
  vStr._4_4_ = -1;
  p = Abc_ManReadFile(pFileName);
  if (p == (Vec_Str_t *)0x0) {
    pFileName_local._4_4_ = -1;
  }
  else {
    pcVar1 = Vec_StrArray(p);
    pcVar1 = strstr(pcVar1,pToken);
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen(pToken);
      vStr._4_4_ = atoi(pcVar1 + sVar2);
    }
    Vec_StrFree(p);
    pFileName_local._4_4_ = vStr._4_4_;
  }
  return pFileName_local._4_4_;
}

Assistant:

int Abc_ManReadInteger( char * pFileName, char * pToken )
{
    int Result = -1;
    Vec_Str_t * vStr;
    char * pStr;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return -1;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
        Result = atoi( pStr + strlen(pToken) );
    Vec_StrFree( vStr );
    return Result;
}